

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O0

nbt_type list_is_homogenous(nbt_list *list)

{
  list_head **pplVar1;
  nbt_list *cur;
  list_head *pos;
  nbt_type type;
  nbt_list *list_local;
  
  pos._4_4_ = TAG_INVALID;
  cur = (nbt_list *)(list->entry).flink;
  while( true ) {
    if (cur == (nbt_list *)&list->entry) {
      if ((pos._4_4_ == TAG_INVALID) && (list->data != (nbt_node *)0x0)) {
        pos._4_4_ = list->data->type;
      }
      return pos._4_4_;
    }
    pplVar1 = &cur[-1].entry.flink;
    if (*pplVar1 == (list_head *)0x0) {
      __assert_fail("cur->data",
                    "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_parsing.c"
                    ,0x10c,"nbt_type list_is_homogenous(const struct nbt_list *)");
    }
    if (*(int *)&(*pplVar1)->blink == 0) {
      __assert_fail("cur->data->type != TAG_INVALID",
                    "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_parsing.c"
                    ,0x10d,"nbt_type list_is_homogenous(const struct nbt_list *)");
    }
    if (*(int *)&(*pplVar1)->blink == 0) break;
    if (pos._4_4_ == TAG_INVALID) {
      pos._4_4_ = *(nbt_type *)&(*pplVar1)->blink;
    }
    if (pos._4_4_ != *(nbt_type *)&(*pplVar1)->blink) {
      return TAG_INVALID;
    }
    cur = (nbt_list *)(cur->entry).blink;
  }
  return TAG_INVALID;
}

Assistant:

static nbt_type list_is_homogenous(const struct nbt_list* list)
{
    nbt_type type = TAG_INVALID;

    const struct list_head* pos;
    list_for_each(pos, &list->entry)
    {
        const struct nbt_list* cur = list_entry(pos, const struct nbt_list, entry);

        assert(cur->data);
        assert(cur->data->type != TAG_INVALID);

        if(cur->data->type == TAG_INVALID)
            return TAG_INVALID;

        /* if we're the first type, just set it to our current type */
        if(type == TAG_INVALID) type = cur->data->type;

        if(type != cur->data->type)
            return TAG_INVALID;
    }

    /* if the list was empty, use the sentinel type */
    if(type == TAG_INVALID && list->data != NULL)
        type = list->data->type;

    return type;
}